

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

RangeListSyntax * __thiscall slang::parsing::Parser::parseRangeList(Parser *this)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token closeBrace_00;
  Token openBrace_00;
  RangeListSyntax *pRVar1;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> list;
  Token closeBrace;
  Token openBrace;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *in_stack_00000140;
  Token *in_stack_00000148;
  TokenKind in_stack_00000152;
  TokenKind in_stack_00000154;
  TokenKind in_stack_00000156;
  ParserBase *in_stack_00000158;
  Token *in_stack_00000170;
  RequireItems in_stack_00000178;
  DiagCode in_stack_00000180;
  anon_class_8_1_8991fb9c *in_stack_00000188;
  AllowEmpty in_stack_00000190;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *valueRanges;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff1c;
  __extent_storage<18446744073709551615UL> _Var4;
  undefined4 uVar5;
  undefined1 in_stack_ffffffffffffff2c [12];
  undefined1 local_50 [12];
  undefined4 local_44;
  
  Token::Token((Token *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  Token::Token((Token *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::span
            ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x2e63b4);
  local_44 = 0x580005;
  valueRanges = (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&stack0xffffffffffffffd0;
  _Var4._M_extent_value = (size_t)local_50;
  uVar2 = 1;
  uVar3 = 0x580005;
  uVar5 = 0;
  ParserBase::
  parseList<&slang::syntax::SyntaxFacts::isPossibleValueRangeElement,&slang::syntax::SyntaxFacts::isEndOfBracedList,slang::parsing::Parser::parseRangeList()::__0>
            (in_stack_00000158,in_stack_00000156,in_stack_00000154,in_stack_00000152,
             in_stack_00000148,in_stack_00000140,in_stack_00000170,in_stack_00000178,
             in_stack_00000180,in_stack_00000188,in_stack_00000190);
  elements._M_ptr._4_4_ = in_stack_ffffffffffffff1c;
  elements._M_ptr._0_4_ = uVar3;
  elements._M_extent._M_extent_value = _Var4._M_extent_value;
  slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
            ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
             CONCAT44(in_stack_ffffffffffffff14,uVar2),elements);
  openBrace_00.rawLen = in_stack_ffffffffffffff2c._0_4_;
  openBrace_00.info = (Info *)in_stack_ffffffffffffff2c._4_8_;
  openBrace_00.kind = (short)uVar5;
  openBrace_00._2_1_ = (char)((uint)uVar5 >> 0x10);
  openBrace_00.numFlags.raw = (char)((uint)uVar5 >> 0x18);
  closeBrace_00.rawLen = in_stack_ffffffffffffff1c;
  closeBrace_00.kind = (short)uVar3;
  closeBrace_00._2_1_ = (char)((uint)uVar3 >> 0x10);
  closeBrace_00.numFlags.raw = (char)((uint)uVar3 >> 0x18);
  closeBrace_00.info = (Info *)_Var4._M_extent_value;
  pRVar1 = slang::syntax::SyntaxFactory::rangeList
                     ((SyntaxFactory *)CONCAT44(in_stack_ffffffffffffff14,uVar2),openBrace_00,
                      valueRanges,closeBrace_00);
  return pRVar1;
}

Assistant:

RangeListSyntax& Parser::parseRangeList() {
    Token openBrace;
    Token closeBrace;
    std::span<TokenOrSyntax> list;

    parseList<isPossibleValueRangeElement, isEndOfBracedList>(
        TokenKind::OpenBrace, TokenKind::CloseBrace, TokenKind::Comma, openBrace, list, closeBrace,
        RequireItems::True, diag::ExpectedValueRangeElement,
        [this] { return &parseValueRangeElement(); });

    return factory.rangeList(openBrace, list, closeBrace);
}